

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O2

GLuint __thiscall gl4cts::GPUShaderFP64Test10::functionObject::getResultStride(functionObject *this)

{
  GLuint GVar1;
  GLuint GVar2;
  GLuint GVar3;
  GLuint i;
  GLuint result;
  
  GVar1 = (*this->_vptr_functionObject[5])();
  GVar3 = 0;
  for (result = 0; GVar1 != result; result = result + 1) {
    GVar2 = getResultStride(this,result);
    GVar3 = GVar3 + GVar2;
  }
  return GVar3;
}

Assistant:

glw::GLuint GPUShaderFP64Test10::functionObject::getResultStride() const
{
	const glw::GLuint n_results = getResultCount();
	glw::GLuint		  stride	= 0;

	for (glw::GLuint i = 0; i < n_results; ++i)
	{
		stride += getResultStride(i);
	}

	return stride;
}